

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-backend-ops.cpp
# Opt level: O1

ggml_tensor * __thiscall test_pool2d::build_graph(test_pool2d *this,ggml_context *ctx)

{
  undefined8 uVar1;
  ggml_tensor *pgVar2;
  
  uVar1 = ggml_new_tensor(ctx,this->type_input,4,&this->ne_input);
  test_case::add_sentinel(&this->super_test_case,ctx);
  ggml_set_param(ctx,uVar1);
  ggml_set_name(uVar1,"input");
  pgVar2 = (ggml_tensor *)
           ggml_pool_2d((float)this->p0,(float)this->p1,ctx,uVar1,this->pool_type,this->k0,this->k1,
                        this->s0,this->s1);
  ggml_set_name(pgVar2,"out");
  return pgVar2;
}

Assistant:

ggml_tensor * build_graph(ggml_context * ctx) override {
        ggml_tensor * input = ggml_new_tensor(ctx, type_input, 4, ne_input.data());
        ggml_set_param(ctx, input);
        ggml_set_name(input, "input");

        ggml_tensor * out = ggml_pool_2d(ctx, input, pool_type, k0, k1, s0, s1, p0, p1);
        ggml_set_name(out, "out");

        return out;
    }